

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::BitwiseXor(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                    uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                    uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  byte *local_b8;
  byte *local_b0;
  byte *local_a8;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *in2X;
  uint8_t *in1X;
  simd *src1End;
  simd *dst;
  simd *src2;
  simd *src1;
  uint8_t *outY_local;
  uint8_t *in2Y_local;
  uint8_t *in1Y_local;
  uint32_t rowSizeOut_local;
  uint32_t rowSizeIn2_local;
  uint32_t rowSizeIn1_local;
  
  outXEnd = in2Y;
  outX = in1Y;
  for (local_80 = (ulong *)outY; local_80 != (ulong *)outYEnd;
      local_80 = (ulong *)((long)local_80 + (ulong)rowSizeOut)) {
    local_90 = (ulong *)outXEnd;
    local_98 = local_80;
    for (local_88 = (ulong *)outX; local_88 != (ulong *)(outX + (ulong)simdWidth * 0x10);
        local_88 = local_88 + 2) {
      uVar1 = local_88[1];
      uVar2 = local_90[1];
      *local_98 = *local_88 ^ *local_90;
      local_98[1] = uVar1 ^ uVar2;
      local_90 = local_90 + 2;
      local_98 = local_98 + 2;
    }
    if (nonSimdWidth != 0) {
      local_a8 = outX + totalSimdWidth;
      local_b0 = outXEnd + totalSimdWidth;
      local_b8 = (byte *)((long)local_80 + (ulong)totalSimdWidth);
      pbVar3 = local_b8 + nonSimdWidth;
      for (; local_b8 != pbVar3; local_b8 = local_b8 + 1) {
        *local_b8 = *local_a8 ^ *local_b0;
        local_a8 = local_a8 + 1;
        local_b0 = local_b0 + 1;
      }
    }
    outX = outX + rowSizeIn1;
    outXEnd = outXEnd + rowSizeIn2;
  }
  return;
}

Assistant:

void BitwiseXor( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                     uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst )
                _mm_storeu_si128( dst, _mm_xor_si128( _mm_loadu_si128( src1 ), _mm_loadu_si128( src2 ) ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = (*in1X) ^ (*in2X);
            }
        }
    }